

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int alloc_addbyter(int output,FILE *data)

{
  CURLcode CVar1;
  byte local_21;
  FILE *pFStack_20;
  uchar outc;
  asprintf *infop;
  FILE *data_local;
  int output_local;
  
  local_21 = (byte)output;
  pFStack_20 = data;
  infop = (asprintf *)data;
  data_local._0_4_ = output;
  CVar1 = Curl_dyn_addn(*(dynbuf **)data,&local_21,1);
  if (CVar1 == CURLE_OK) {
    data_local._4_4_ = (uint)local_21;
  }
  else {
    *(undefined1 *)&pFStack_20->_IO_read_ptr = 1;
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

static int alloc_addbyter(int output, FILE *data)
{
  struct asprintf *infop = (struct asprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(Curl_dyn_addn(infop->b, &outc, 1)) {
    infop->fail = 1;
    return -1; /* fail */
  }
  return outc; /* fputc() returns like this on success */
}